

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::adjust_volumes
          (geofile *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Self __tmp_1;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_header *p_Var8;
  iterator vector_it_end;
  _Self __tmp;
  node_type local_70;
  insert_return_type local_58;
  
  p_Var1 = &(changes->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::extract(&local_70,&(this->volumes_map)._M_t,(key_type *)(p_Var6 + 1));
      if (local_70.
          super__Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
          ._M_ptr != (pointer)0x0) {
        *local_70._M_pkey = *(int *)&p_Var6[1].field_0x4;
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::_M_reinsert_node_unique(&local_58,&(this->volumes_map)._M_t,&local_70);
        if (local_58.node.
            super__Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
            ._M_ptr != (pointer)0x0) {
          operator_delete(local_58.node.
                          super__Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
                          ._M_ptr,0x28);
          local_58.node.
          super__Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
          ._M_ptr = (pointer)0x0;
        }
        if (local_70.
            super__Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
            ._M_ptr != (pointer)0x0) {
          operator_delete(local_70.
                          super__Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
                          ._M_ptr,0x28);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  p_Var6 = (this->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    p_Var2 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((_Rb_tree_header *)p_Var2 != p_Var1) {
        p_Var3 = *(_Base_ptr *)(p_Var6 + 2);
        p_Var4 = p_Var6[2]._M_parent;
        p_Var5 = p_Var3;
        p_Var7 = p_Var2;
        do {
          for (; p_Var5 != p_Var4; p_Var5 = (_Base_ptr)&p_Var5->field_0x4) {
            if (p_Var5->_M_color == p_Var7[1]._M_color) {
              p_Var5->_M_color = *(_Rb_tree_color *)&p_Var7[1].field_0x4;
            }
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          p_Var5 = p_Var3;
        } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  return 0;
}

Assistant:

int GEO::geofile::adjust_volumes(std::map<int,int> changes)
{
    auto change_end = changes.end();
    for (auto i = changes.begin(); i != change_end; i++)
    {
        auto nodeHandler = volumes_map.extract(i->first);
        if(!nodeHandler.empty())
        {
            nodeHandler.key() = i->second;
            volumes_map.insert(std::move(nodeHandler));
        }
    }
    // Adjust dependencies to mirror the changes.
    // Physical volumes
    auto phys_vol_map_end  = physical_volumes_map.end();
    for (auto phys_vol_map_it = physical_volumes_map.begin(); phys_vol_map_it != phys_vol_map_end; phys_vol_map_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            auto vector_it_end = phys_vol_map_it->second.end();
            for (auto vector_it = phys_vol_map_it->second.begin(); vector_it != vector_it_end; vector_it++)
            {
                if(*vector_it==i->first)
                    *vector_it=i->second;
            }
        }
    }
    return EXIT_SUCCESS;
}